

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOut::PutPointer
          (ChArchiveOut *this,void *object,bool *already_stored,size_t *obj_ID)

{
  mapped_type mVar1;
  bool bVar2;
  mapped_type *pmVar3;
  bool *local_50;
  bool *local_48;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> local_40;
  void *local_38;
  _Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false> local_30;
  mapped_type *local_28;
  size_t *obj_ID_local;
  bool *already_stored_local;
  void *object_local;
  ChArchiveOut *this_local;
  
  local_38 = object;
  local_28 = obj_ID;
  obj_ID_local = (size_t *)already_stored;
  already_stored_local = (bool *)object;
  object_local = this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::find((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
               *)(this + 0x50),&local_38);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::end((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)(this + 0x50));
  bVar2 = std::__detail::operator!=(&local_30,&local_40);
  if (bVar2) {
    *(undefined1 *)obj_ID_local = 1;
    local_48 = already_stored_local;
    pmVar3 = std::
             unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::operator[]((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                           *)(this + 0x50),&local_48);
    *local_28 = *pmVar3;
  }
  else {
    *(long *)(this + 0x88) = *(long *)(this + 0x88) + 1;
    *local_28 = *(mapped_type *)(this + 0x88);
    mVar1 = *local_28;
    local_50 = already_stored_local;
    pmVar3 = std::
             unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::operator[]((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                           *)(this + 0x50),&local_50);
    *pmVar3 = mVar1;
    *(undefined1 *)obj_ID_local = 0;
  }
  return;
}

Assistant:

void PutPointer(void* object, bool& already_stored, size_t& obj_ID) {
            if (this->internal_ptr_id.find(static_cast<void*>(object)) != this->internal_ptr_id.end()) {
              already_stored = true;
              obj_ID = internal_ptr_id[static_cast<void*>(object)];
              return;
            }

            // wasn't in list.. add to it
            ++currentID;
            obj_ID = currentID;
            internal_ptr_id[static_cast<void*>(object)] = obj_ID;
            already_stored = false;
            return;
        }